

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O1

double coda_PlusInf(void)

{
  return INFINITY;
}

Assistant:

LIBCODA_API double coda_PlusInf(void)
{
    union
    {
        uint64_t as_int;
        double as_double;
    } mkInf;

    mkInf.as_int = 0x7ff0;
    mkInf.as_int <<= 48;

    return mkInf.as_double;
}